

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

void google::SetArgv(int argc,char **argv)

{
  long lVar1;
  ulong uVar2;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (SetArgv(int,char_const**)::called_set_argv == '\0') {
    SetArgv(int,char_const**)::called_set_argv = '\x01';
    if (argc < 1) {
      __assert_fail("argc > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                    ,0x5d3,"void google::SetArgv(int, const char **)");
    }
    std::__cxx11::string::assign((char *)&argv0_abi_cxx11_);
    DAT_001d6188 = 0;
    *cmdline_abi_cxx11_ = 0;
    for (uVar2 = 0; (uint)argc != uVar2; uVar2 = uVar2 + 1) {
      if (uVar2 != 0) {
        std::__cxx11::string::append((char *)&cmdline_abi_cxx11_);
      }
      std::__cxx11::string::append((char *)&cmdline_abi_cxx11_);
      std::__cxx11::string::string((string *)&local_50,argv[uVar2],&local_51);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &argvs_abi_cxx11_,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    argv_sum = 0;
    for (lVar1 = 0; DAT_001d6188 != lVar1; lVar1 = lVar1 + 1) {
      argv_sum = argv_sum + (char)cmdline_abi_cxx11_[lVar1];
    }
  }
  return;
}

Assistant:

void SetArgv(int argc, const char** argv) {
  static bool called_set_argv = false;
  if (called_set_argv) return;
  called_set_argv = true;

  assert(argc > 0); // every program has at least a name
  argv0 = argv[0];

  cmdline.clear();
  for (int i = 0; i < argc; i++) {
    if (i != 0) cmdline += " ";
    cmdline += argv[i];
    argvs.push_back(argv[i]);
  }

  // Compute a simple sum of all the chars in argv
  argv_sum = 0;
  for (string::const_iterator c = cmdline.begin(); c != cmdline.end(); ++c) {
    argv_sum += *c;
  }
}